

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.cpp
# Opt level: O0

void __thiscall Format::Override(Format *this,bool full_control)

{
  int iVar1;
  bool full_control_local;
  Format *this_local;
  
  if (full_control) {
    iVar1 = Range::cyls(&opt.range);
    if (iVar1 != 0) {
      iVar1 = Range::cyls(&opt.range);
      this->cyls = iVar1;
    }
    iVar1 = Range::heads(&opt.range);
    if (iVar1 != 0) {
      iVar1 = Range::heads(&opt.range);
      this->heads = iVar1;
    }
    if (opt.sectors != -1) {
      this->sectors = (int)opt.sectors;
    }
    if ((-1 < opt.size) && (opt.size < 8)) {
      this->size = opt.size;
    }
    if (this->datarate == Unknown) {
      this->datarate = _250K;
    }
    if (this->encoding == Unknown) {
      this->encoding = MFM;
    }
  }
  if (-1 < opt.fill) {
    this->fill = (uint8_t)opt.fill;
  }
  if (-1 < opt.gap3) {
    this->gap3 = opt.gap3;
  }
  if (opt.base != -1) {
    this->base = opt.base;
  }
  if (-1 < opt.interleave) {
    this->interleave = opt.interleave;
  }
  if (-1 < opt.skew) {
    this->skew = opt.skew;
  }
  if (opt.head0 != -1) {
    this->head0 = opt.head0;
  }
  if (opt.head1 != -1) {
    this->head1 = opt.head1;
  }
  if (opt.cylsfirst != -1) {
    this->cyls_first = opt.cylsfirst != 0;
  }
  if (opt.datarate != Unknown) {
    this->datarate = opt.datarate;
  }
  if (opt.encoding != Unknown) {
    this->encoding = opt.encoding;
  }
  return;
}

Assistant:

void Format::Override(bool full_control/*=false*/)
{
    if (full_control)
    {
        if (opt.range.cyls()) cyls = opt.range.cyls();
        if (opt.range.heads()) heads = opt.range.heads();
        if (opt.sectors != -1) sectors = opt.sectors;
        if (opt.size >= 0 && opt.size <= 7) size = opt.size;

        if (datarate == DataRate::Unknown) datarate = DataRate::_250K;
        if (encoding == Encoding::Unknown) encoding = Encoding::MFM;
    }

    // Merge any overrides from the command-line
    if (opt.fill >= 0) fill = static_cast<uint8_t>(opt.fill);
    if (opt.gap3 >= 0) gap3 = opt.gap3;
    if (opt.base != -1) base = opt.base;
    if (opt.interleave >= 0) interleave = opt.interleave;
    if (opt.skew >= 0) skew = opt.skew;
    if (opt.head0 != -1) head0 = opt.head0;
    if (opt.head1 != -1) head1 = opt.head1;
    if (opt.cylsfirst != -1) cyls_first = (opt.cylsfirst != 0);
    if (opt.datarate != DataRate::Unknown) datarate = opt.datarate;
    if (opt.encoding != Encoding::Unknown) encoding = opt.encoding;
}